

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

void j2k_setup_decoder(opj_j2k_t *j2k,opj_dparameters_t *parameters)

{
  int iVar1;
  opj_cp_t *poVar2;
  
  if (parameters != (opj_dparameters_t *)0x0 && j2k != (opj_j2k_t *)0x0) {
    poVar2 = (opj_cp_t *)calloc(1,0x90);
    iVar1 = parameters->cp_layer;
    poVar2->reduce = parameters->cp_reduce;
    poVar2->layer = iVar1;
    poVar2->limit_decoding = parameters->cp_limit_decoding;
    j2k->cp = poVar2;
  }
  return;
}

Assistant:

void j2k_setup_decoder(opj_j2k_t *j2k, opj_dparameters_t *parameters) {
	if(j2k && parameters) {
		/* create and initialize the coding parameters structure */
		opj_cp_t *cp = (opj_cp_t*) opj_calloc(1, sizeof(opj_cp_t));
		cp->reduce = parameters->cp_reduce;	
		cp->layer = parameters->cp_layer;
		cp->limit_decoding = parameters->cp_limit_decoding;

#ifdef USE_JPWL
		cp->correct = parameters->jpwl_correct;
		cp->exp_comps = parameters->jpwl_exp_comps;
		cp->max_tiles = parameters->jpwl_max_tiles;
#endif /* USE_JPWL */


		/* keep a link to cp so that we can destroy it later in j2k_destroy_decompress */
		j2k->cp = cp;
	}
}